

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operator.cpp
# Opt level: O2

ssize_t ExprEval::Operator::BaseSpecification::read(int __fd,void *__buf,size_t __nbytes)

{
  byte bVar1;
  istream *piVar2;
  size_type __new_size;
  ssize_t sVar3;
  Exception *this;
  undefined4 in_register_0000003c;
  string *psVar4;
  byte bVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  variables;
  string expression;
  string token;
  string line;
  string symbol;
  string local_3e0;
  stringstream stream;
  ostream local_3b0 [376];
  ifstream file;
  byte abStack_218 [488];
  
  std::ifstream::ifstream(&file,(string *)CONCAT44(in_register_0000003c,__fd),_S_in);
  if ((abStack_218[*(long *)(_file + -0x18)] & 5) != 0) {
    this = (Exception *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&local_3e0,"Cannot open the specification file!",(allocator *)&stream);
    Engine::Exception::Exception(this,File,&local_3e0);
    __cxa_throw(this,&Engine::Exception::typeinfo,Engine::Exception::~Exception);
  }
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  token._M_dataplus._M_p = (pointer)&token.field_2;
  token._M_string_length = 0;
  token.field_2._M_local_buf[0] = '\0';
  std::__cxx11::stringstream::stringstream((stringstream *)&stream);
  symbol._M_dataplus._M_p = (pointer)&symbol.field_2;
  symbol._M_string_length = 0;
  symbol.field_2._M_local_buf[0] = '\0';
  variables.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  variables.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  variables.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  expression._M_dataplus._M_p = (pointer)&expression.field_2;
  expression._M_string_length = 0;
  expression.field_2._M_local_buf[0] = '\0';
LAB_0010bfee:
  piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                     ((istream *)&file,(string *)&line);
  if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) {
    std::ifstream::close();
    std::__cxx11::string::~string((string *)&expression);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&variables);
    std::__cxx11::string::~string((string *)&symbol);
    std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
    std::__cxx11::string::~string((string *)&token);
    std::__cxx11::string::~string((string *)&line);
    sVar3 = std::ifstream::~ifstream(&file);
    return sVar3;
  }
  std::ios::clear((int)*(undefined8 *)(_stream + -0x18) + (int)(stringstream *)&stream);
  std::operator<<(local_3b0,(string *)&line);
  bVar5 = 0;
LAB_0010c039:
  do {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&stream,(string *)&token,',');
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
    bVar1 = bVar5 + 1;
    psVar4 = &symbol;
    if (bVar5 != 0) {
      if (bVar5 == 1) {
        __new_size = atol(token._M_dataplus._M_p);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::resize(&variables,__new_size);
        bVar5 = bVar1;
        goto LAB_0010c039;
      }
      psVar4 = &expression;
      if (2 < bVar1) {
        if ((ulong)(uint)bVar1 <=
            ((long)variables.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)variables.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5) + 2U) {
          psVar4 = variables.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + (bVar1 - 3);
        }
      }
    }
    std::__cxx11::string::_M_assign((string *)psVar4);
    bVar5 = bVar1;
  } while( true );
  add_custom_operator(&symbol,&variables,&expression);
  goto LAB_0010bfee;
}

Assistant:

void BaseSpecification::read(const std::string& file_path){
            auto table = custom_operator_table;
            std::ifstream file(file_path);

            if(!file){
                throw Engine::Exception(Engine::Error::File, "Cannot open the specification file!");
            }

            std::string line;
            std::string token;
            std::stringstream stream;
            std::string symbol;
            std::vector<std::string> variables;
            std::string expression;
            while(std::getline(file, line)){
                unsigned char count = 0;
                stream.clear();
                stream << line;
                while(std::getline(stream, token, ',')){
                    ++count;
                    if(count == 1){
                        symbol = token;
                    }
                    else if(count == 2){
                        variables.resize(atol(token.c_str()));
                    }
                    else if(count > 2 && count <= variables.size() + 2){
                        variables[count-3] = token;
                    }
                    else{
                        expression = token;
                    }
                }
                add_custom_operator(symbol, variables, expression);
            }

            file.close();
        }